

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O0

UText * utext_openConstUnicodeString_63(UText *ut,UnicodeString *s,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  char16_t *pcVar3;
  UErrorCode *status_local;
  UnicodeString *s_local;
  UText *ut_local;
  
  UVar1 = U_SUCCESS(*status);
  if ((UVar1 == '\0') || (UVar1 = icu_63::UnicodeString::isBogus(s), UVar1 == '\0')) {
    ut_local = utext_setup_63(ut,0,status);
    UVar1 = U_SUCCESS(*status);
    if (UVar1 != '\0') {
      ut_local->pFuncs = &unistrFuncs;
      ut_local->context = s;
      ut_local->providerProperties = 4;
      pcVar3 = icu_63::UnicodeString::getBuffer(s);
      ut_local->chunkContents = pcVar3;
      iVar2 = icu_63::UnicodeString::length(s);
      ut_local->chunkLength = iVar2;
      ut_local->chunkNativeStart = 0;
      ut_local->chunkNativeLimit = (long)ut_local->chunkLength;
      ut_local->nativeIndexingLimit = ut_local->chunkLength;
    }
  }
  else {
    utext_openUChars_63(ut,(UChar *)0x0,0,status);
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    ut_local = ut;
  }
  return ut_local;
}

Assistant:

U_CAPI UText * U_EXPORT2
utext_openConstUnicodeString(UText *ut, const UnicodeString *s, UErrorCode *status) {
    if (U_SUCCESS(*status) && s->isBogus()) {
        // The UnicodeString is bogus, but we still need to detach the UText
        //   from whatever it was hooked to before, if anything.
        utext_openUChars(ut, NULL, 0, status);
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return ut;
    }
    ut = utext_setup(ut, 0, status);
    //    note:  use the standard (writable) function table for UnicodeString.
    //           The flag settings disable writing, so having the functions in
    //           the table is harmless.
    if (U_SUCCESS(*status)) {
        ut->pFuncs              = &unistrFuncs;
        ut->context             = s;
        ut->providerProperties  = I32_FLAG(UTEXT_PROVIDER_STABLE_CHUNKS);
        ut->chunkContents       = s->getBuffer();
        ut->chunkLength         = s->length();
        ut->chunkNativeStart    = 0;
        ut->chunkNativeLimit    = ut->chunkLength;
        ut->nativeIndexingLimit = ut->chunkLength;
    }
    return ut;
}